

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::Descriptor::DebugString(Descriptor *this,int depth,string *contents)

{
  long *plVar1;
  _Base_ptr p_Var2;
  int iVar3;
  size_t sVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  _Base_ptr p_Var8;
  int depth_00;
  long lVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  long lVar12;
  long lVar13;
  string prefix;
  SubstituteArg local_240;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  std::__cxx11::string::append((char *)contents);
  depth_00 = depth + 1;
  anon_unknown_1::FormatLineOptions(depth_00,*(Message **)(this + 0x20),contents);
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &groups._M_t._M_impl.super__Rb_tree_header._M_header;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  groups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar3 = *(int *)(this + 0x2c);
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < iVar3) {
    lVar6 = 0x48;
    lVar12 = 0;
    do {
      if (*(int *)(*(long *)(this + 0x30) + -0x1c + lVar6) == 10) {
        local_210.text_ = *(char **)(*(long *)(this + 0x30) + lVar6);
        std::
        _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_insert_unique<google::protobuf::Descriptor_const*>
                  ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                    *)&groups,(Descriptor **)&local_210);
        iVar3 = *(int *)(this + 0x2c);
      }
      lVar12 = lVar12 + 1;
      lVar6 = lVar6 + 0x78;
    } while (lVar12 < iVar3);
  }
  iVar3 = *(int *)(this + 0x68);
  if (0 < iVar3) {
    lVar6 = 0x48;
    lVar12 = 0;
    do {
      if (*(int *)(*(long *)(this + 0x70) + -0x1c + lVar6) == 10) {
        local_210.text_ = *(char **)(*(long *)(this + 0x70) + lVar6);
        std::
        _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_insert_unique<google::protobuf::Descriptor_const*>
                  ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                    *)&groups,(Descriptor **)&local_210);
        iVar3 = *(int *)(this + 0x68);
      }
      lVar12 = lVar12 + 1;
      lVar6 = lVar6 + 0x78;
    } while (lVar12 < iVar3);
  }
  iVar3 = *(int *)(this + 0x38);
  if (0 < iVar3) {
    lVar6 = 0;
    do {
      plVar5 = (long *)(*(long *)(this + 0x40) + lVar6 * 0x78);
      if (groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_001ce8bb:
        local_210.text_ = prefix._M_dataplus._M_p;
        local_210.size_ = (int)prefix._M_string_length;
        local_c0.text_ = *(char **)*plVar5;
        local_c0.size_ = *(int *)((undefined8 *)*plVar5 + 1);
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_1e0.text_ = (char *)0x0;
        local_1e0.size_ = -1;
        local_240.text_ = (char *)0x0;
        local_240.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"$0  message $1",&local_210,&local_c0,&local_f0,&local_90,&local_120,
                   &local_150,&local_180,&local_1b0,&local_1e0,&local_240);
        DebugString((Descriptor *)(lVar6 * 0x78 + *(long *)(this + 0x40)),depth_00,contents);
        iVar3 = *(int *)(this + 0x38);
      }
      else {
        p_Var2 = groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 = &groups._M_t._M_impl.super__Rb_tree_header._M_header;
        do {
          p_Var10 = p_Var11;
          p_Var8 = p_Var2;
          plVar1 = *(long **)(p_Var8 + 1);
          p_Var11 = p_Var8;
          if (plVar1 < plVar5) {
            p_Var11 = p_Var10;
          }
          p_Var2 = (&p_Var8->_M_left)[plVar1 < plVar5];
        } while ((&p_Var8->_M_left)[plVar1 < plVar5] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var11 == &groups._M_t._M_impl.super__Rb_tree_header)
        goto LAB_001ce8bb;
        if (plVar1 < plVar5) {
          p_Var8 = p_Var10;
        }
        if (plVar5 < *(long **)(p_Var8 + 1)) goto LAB_001ce8bb;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar3);
  }
  if (0 < *(int *)(this + 0x48)) {
    lVar6 = 0;
    lVar12 = 0;
    do {
      EnumDescriptor::DebugString
                ((EnumDescriptor *)(*(long *)(this + 0x50) + lVar6),depth_00,contents);
      lVar12 = lVar12 + 1;
      lVar6 = lVar6 + 0x38;
    } while (lVar12 < *(int *)(this + 0x48));
  }
  if (0 < *(int *)(this + 0x2c)) {
    lVar6 = 0;
    lVar12 = 0;
    do {
      FieldDescriptor::DebugString
                ((FieldDescriptor *)(*(long *)(this + 0x30) + lVar6),depth_00,contents);
      lVar12 = lVar12 + 1;
      lVar6 = lVar6 + 0x78;
    } while (lVar12 < *(int *)(this + 0x2c));
  }
  if (0 < *(int *)(this + 0x58)) {
    lVar6 = 0;
    do {
      local_210.text_ = prefix._M_dataplus._M_p;
      local_210.size_ = (int)prefix._M_string_length;
      local_c0.text_ =
           FastInt32ToBuffer(*(int32 *)(*(long *)(this + 0x60) + lVar6 * 8),local_c0.scratch_);
      sVar4 = strlen(local_c0.text_);
      local_c0.size_ = (int)sVar4;
      local_f0.text_ =
           FastInt32ToBuffer(*(int *)(*(long *)(this + 0x60) + 4 + lVar6 * 8) + -1,local_f0.scratch_
                            );
      sVar4 = strlen(local_f0.text_);
      local_f0.size_ = (int)sVar4;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_1e0.text_ = (char *)0x0;
      local_1e0.size_ = -1;
      local_240.text_ = (char *)0x0;
      local_240.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  extensions $1 to $2;\n",&local_210,&local_c0,&local_f0,&local_90,
                 &local_120,&local_150,&local_180,&local_1b0,&local_1e0,&local_240);
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)(this + 0x58));
  }
  if (0 < *(int *)(this + 0x68)) {
    lVar12 = 0;
    lVar13 = 0;
    lVar6 = 0;
    do {
      lVar9 = *(long *)(this + 0x70);
      lVar7 = *(long *)(lVar9 + 0x38 + lVar12);
      if (lVar7 != lVar6) {
        if (lVar12 != 0) {
          local_210.text_ = prefix._M_dataplus._M_p;
          local_210.size_ = (int)prefix._M_string_length;
          local_c0.text_ = (char *)0x0;
          local_c0.size_ = -1;
          local_f0.text_ = (char *)0x0;
          local_f0.size_ = -1;
          local_90.text_ = (char *)0x0;
          local_90.size_ = -1;
          local_120.text_ = (char *)0x0;
          local_120.size_ = -1;
          local_150.text_ = (char *)0x0;
          local_150.size_ = -1;
          local_180.text_ = (char *)0x0;
          local_180.size_ = -1;
          local_1b0.text_ = (char *)0x0;
          local_1b0.size_ = -1;
          local_1e0.text_ = (char *)0x0;
          local_1e0.size_ = -1;
          local_240.text_ = (char *)0x0;
          local_240.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"$0  }\n",&local_210,&local_c0,&local_f0,&local_90,&local_120,
                     &local_150,&local_180,&local_1b0,&local_1e0,&local_240);
          lVar7 = *(long *)(*(long *)(this + 0x70) + 0x38 + lVar12);
        }
        local_210.text_ = prefix._M_dataplus._M_p;
        local_210.size_ = (int)prefix._M_string_length;
        local_c0.text_ = (char *)**(undefined8 **)(lVar7 + 8);
        local_c0.size_ = *(int *)(*(undefined8 **)(lVar7 + 8) + 1);
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_1e0.text_ = (char *)0x0;
        local_1e0.size_ = -1;
        local_240.text_ = (char *)0x0;
        local_240.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"$0  extend .$1 {\n",&local_210,&local_c0,&local_f0,&local_90,&local_120
                   ,&local_150,&local_180,&local_1b0,&local_1e0,&local_240);
        lVar9 = *(long *)(this + 0x70);
        lVar6 = lVar7;
      }
      FieldDescriptor::DebugString((FieldDescriptor *)(lVar9 + lVar12),depth + 2,contents);
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x78;
    } while (lVar13 < *(int *)(this + 0x68));
    if (0 < *(int *)(this + 0x68)) {
      local_210.text_ = prefix._M_dataplus._M_p;
      local_210.size_ = (int)prefix._M_string_length;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_1e0.text_ = (char *)0x0;
      local_1e0.size_ = -1;
      local_240.text_ = (char *)0x0;
      local_240.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  }\n",&local_210,&local_c0,&local_f0,&local_90,&local_120,&local_150,
                 &local_180,&local_1b0,&local_1e0,&local_240);
    }
  }
  local_210.text_ = prefix._M_dataplus._M_p;
  local_210.size_ = (int)prefix._M_string_length;
  local_c0.text_ = (char *)0x0;
  local_c0.size_ = -1;
  local_f0.text_ = (char *)0x0;
  local_f0.size_ = -1;
  local_90.text_ = (char *)0x0;
  local_90.size_ = -1;
  local_120.text_ = (char *)0x0;
  local_120.size_ = -1;
  local_150.text_ = (char *)0x0;
  local_150.size_ = -1;
  local_180.text_ = (char *)0x0;
  local_180.size_ = -1;
  local_1b0.text_ = (char *)0x0;
  local_1b0.size_ = -1;
  local_1e0.text_ = (char *)0x0;
  local_1e0.size_ = -1;
  local_240.text_ = (char *)0x0;
  local_240.size_ = -1;
  strings::SubstituteAndAppend
            (contents,"$0}\n",&local_210,&local_c0,&local_f0,&local_90,&local_120,&local_150,
             &local_180,&local_1b0,&local_1e0,&local_240);
  std::
  _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~_Rb_tree(&groups._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prefix._M_dataplus._M_p != &prefix.field_2) {
    operator_delete(prefix._M_dataplus._M_p,prefix.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Descriptor::DebugString(int depth, string *contents) const {
  string prefix(depth * 2, ' ');
  ++depth;
  contents->append(" {\n");

  FormatLineOptions(depth, options(), contents);

  // Find all the 'group' types for fields and extensions; we will not output
  // their nested definitions (those will be done with their group field
  // descriptor).
  set<const Descriptor*> groups;
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(field(i)->message_type());
    }
  }
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < nested_type_count(); i++) {
    if (groups.count(nested_type(i)) == 0) {
      strings::SubstituteAndAppend(contents, "$0  message $1",
                                   prefix, nested_type(i)->name());
      nested_type(i)->DebugString(depth, contents);
    }
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(depth, contents);
  }
  for (int i = 0; i < field_count(); i++) {
    field(i)->DebugString(depth, contents);
  }

  for (int i = 0; i < extension_range_count(); i++) {
    strings::SubstituteAndAppend(contents, "$0  extensions $1 to $2;\n",
                                 prefix,
                                 extension_range(i)->start,
                                 extension_range(i)->end - 1);
  }

  // Group extensions by what they extend, so they can be printed out together.
  const Descriptor* containing_type = NULL;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) strings::SubstituteAndAppend(contents, "$0  }\n", prefix);
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(contents, "$0  extend .$1 {\n",
                                   prefix, containing_type->full_name());
    }
    extension(i)->DebugString(depth + 1, contents);
  }
  if (extension_count() > 0)
    strings::SubstituteAndAppend(contents, "$0  }\n", prefix);

  strings::SubstituteAndAppend(contents, "$0}\n", prefix);
}